

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O1

uint M_NextPNGChunk(PNGHandle *png,DWORD id)

{
  uint uVar1;
  DWORD *pDVar2;
  uint uVar3;
  
  uVar1 = (png->Chunks).Count;
  uVar3 = png->ChunkPt;
  if (uVar3 < uVar1) {
    pDVar2 = &(png->Chunks).Array[uVar3].Offset;
    do {
      uVar3 = uVar3 + 1;
      if (((Chunk *)(pDVar2 + -1))->ID == id) {
        png->ChunkPt = uVar3;
        (*(png->File->super_FileReaderBase)._vptr_FileReaderBase[4])(png->File,(ulong)*pDVar2,0);
        return (png->Chunks).Array[png->ChunkPt - 1].Size;
      }
      png->ChunkPt = uVar3;
      pDVar2 = pDVar2 + 3;
    } while (uVar3 != uVar1);
  }
  return 0;
}

Assistant:

unsigned int M_NextPNGChunk (PNGHandle *png, DWORD id)
{
	for ( ; png->ChunkPt < png->Chunks.Size(); ++png->ChunkPt)
	{
		if (png->Chunks[png->ChunkPt].ID == id)
		{ // Found the chunk
			png->File->Seek (png->Chunks[png->ChunkPt++].Offset, SEEK_SET);
			return png->Chunks[png->ChunkPt - 1].Size;
		}
	}
	return 0;
}